

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O2

int space_mixer_set(uint32_t field,void *value,mixed_segment *segment)

{
  float fVar1;
  space_mixer_data *data;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  mixed_channel_t mVar5;
  mixed_channel_t mVar6;
  mixed_channel_t mVar7;
  mixed_channel_t mVar8;
  mixed_channel_t mVar9;
  mixed_channel_t mVar10;
  mixed_channel_t mVar11;
  int iVar12;
  mixed_channel_configuration *pmVar13;
  mixed_buffer **ppmVar14;
  
  data = (space_mixer_data *)segment->data;
  switch(field) {
  case 0xc:
    fVar1 = *value;
    if ((data->location[0] == fVar1) && (!NAN(data->location[0]) && !NAN(fVar1))) {
      if ((data->location[1] == *(float *)((long)value + 4)) &&
         (!NAN(data->location[1]) && !NAN(*(float *)((long)value + 4)))) {
        if ((data->location[2] == *(float *)((long)value + 8)) &&
           (!NAN(data->location[2]) && !NAN(*(float *)((long)value + 8)))) {
          return 1;
        }
      }
    }
    data->location[0] = fVar1;
    data->location[1] = *(float *)((long)value + 4);
    data->location[2] = *(float *)((long)value + 8);
    break;
  case 0xd:
    fVar1 = *value;
    if ((data->direction[0] == fVar1) && (!NAN(data->direction[0]) && !NAN(fVar1))) {
      if ((data->direction[1] == *(float *)((long)value + 4)) &&
         (!NAN(data->direction[1]) && !NAN(*(float *)((long)value + 4)))) {
        if ((data->direction[2] == *(float *)((long)value + 8)) &&
           (!NAN(data->direction[2]) && !NAN(*(float *)((long)value + 8)))) {
          return 1;
        }
      }
    }
    data->direction[0] = fVar1;
    data->direction[1] = *(float *)((long)value + 4);
    data->direction[2] = *(float *)((long)value + 8);
    goto LAB_0013ffde;
  case 0xe:
    fVar1 = *value;
    if ((data->velocity[0] == fVar1) && (!NAN(data->velocity[0]) && !NAN(fVar1))) {
      if ((data->velocity[1] == *(float *)((long)value + 4)) &&
         (!NAN(data->velocity[1]) && !NAN(*(float *)((long)value + 4)))) {
        if ((data->velocity[2] == *(float *)((long)value + 8)) &&
           (!NAN(data->velocity[2]) && !NAN(*(float *)((long)value + 8)))) {
          return 1;
        }
      }
    }
    data->velocity[0] = fVar1;
    data->velocity[1] = *(float *)((long)value + 4);
    data->velocity[2] = *(float *)((long)value + 8);
    break;
  case 0xf:
    fVar1 = *value;
    if ((data->up[0] == fVar1) && (!NAN(data->up[0]) && !NAN(fVar1))) {
      if ((data->up[1] == *(float *)((long)value + 4)) &&
         (!NAN(data->up[1]) && !NAN(*(float *)((long)value + 4)))) {
        if ((data->up[2] == *(float *)((long)value + 8)) &&
           (!NAN(data->up[2]) && !NAN(*(float *)((long)value + 8)))) {
          return 1;
        }
      }
    }
    data->up[0] = fVar1;
    data->up[1] = *(float *)((long)value + 4);
    data->up[2] = *(float *)((long)value + 8);
LAB_0013ffde:
    recompute_look_at(data);
    break;
  case 0x10:
    data->soundspeed = *value;
    break;
  case 0x11:
    data->doppler_factor = *value;
    break;
  case 0x12:
    data->min_distance = *value;
    break;
  case 0x13:
    data->max_distance = *value;
    break;
  case 0x14:
    data->rolloff = *value;
    break;
  case 0x15:
    if (*value - 1U < 4) {
      value = (&PTR_attenuation_none_002b6c30)[*value - 1U];
    }
    data->attenuation = (_func_float_float_float_float_float *)value;
    break;
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
switchD_0013fe08_caseD_16:
    mixed_err(7);
    return 0;
  case 0x25:
    pmVar13 = mixed_default_channel_configuration(*value);
    mVar5 = pmVar13->positions[0];
    mVar6 = pmVar13->positions[1];
    mVar7 = pmVar13->positions[2];
    mVar8 = pmVar13->positions[3];
    mVar9 = pmVar13->positions[4];
    mVar10 = pmVar13->positions[5];
    mVar11 = pmVar13->positions[6];
    uVar2 = *(undefined8 *)(pmVar13->positions + 7);
    uVar3 = *(undefined8 *)(pmVar13->positions + 0xf);
    uVar4 = *(undefined8 *)(pmVar13->positions + 0x17);
    (data->channels).count = pmVar13->count;
    (data->channels).positions[0] = mVar5;
    (data->channels).positions[1] = mVar6;
    (data->channels).positions[2] = mVar7;
    (data->channels).positions[3] = mVar8;
    (data->channels).positions[4] = mVar9;
    (data->channels).positions[5] = mVar10;
    (data->channels).positions[6] = mVar11;
    *(undefined8 *)((data->channels).positions + 7) = uVar2;
    *(undefined8 *)((data->channels).positions + 0xf) = uVar3;
    *(undefined8 *)((data->channels).positions + 0x17) = uVar4;
    *(undefined2 *)((data->channels).positions + 0x1f) = *(undefined2 *)(pmVar13->positions + 0x1f);
    goto LAB_00140081;
  default:
    if (field != 0x3d) {
      if (field == 3) {
        data->volume = *value;
        return 1;
      }
      goto switchD_0013fe08_caseD_16;
    }
    *(undefined2 *)((data->channels).positions + 0x1f) = *(undefined2 *)((long)value + 0x20);
    uVar2 = *value;
    uVar3 = *(undefined8 *)((long)value + 8);
    uVar4 = *(undefined8 *)((long)value + 0x18);
    *(undefined8 *)((data->channels).positions + 0xf) = *(undefined8 *)((long)value + 0x10);
    *(undefined8 *)((data->channels).positions + 0x17) = uVar4;
    (data->channels).count = (char)uVar2;
    (data->channels).positions[0] = (char)((ulong)uVar2 >> 8);
    (data->channels).positions[1] = (char)((ulong)uVar2 >> 0x10);
    (data->channels).positions[2] = (char)((ulong)uVar2 >> 0x18);
    (data->channels).positions[3] = (char)((ulong)uVar2 >> 0x20);
    (data->channels).positions[4] = (char)((ulong)uVar2 >> 0x28);
    (data->channels).positions[5] = (char)((ulong)uVar2 >> 0x30);
    (data->channels).positions[6] = (char)((ulong)uVar2 >> 0x38);
    *(undefined8 *)((data->channels).positions + 7) = uVar3;
LAB_00140081:
    iVar12 = make_vbap_from_configuration(&data->channels,&data->vbap);
    if (iVar12 == 0) {
      return 0;
    }
    ppmVar14 = (mixed_buffer **)(*mixed_realloc)(data->out,(ulong)(data->channels).count << 3);
    data->out = ppmVar14;
    if (ppmVar14 == (mixed_buffer **)0x0) {
      mixed_err(1);
      return 0;
    }
    iVar12 = mixed_configuration_is_surround(&data->channels);
    data->surround = iVar12 != 0;
  }
  mark_sources_dirty(data);
  return 1;
}

Assistant:

int space_mixer_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  float *parts = (float *)value;
  switch(field){
  case MIXED_VOLUME:
    data->volume = *((float *)value);
    break;
  case MIXED_SPACE_LOCATION:
    if(data->location[0] != parts[0] ||
       data->location[1] != parts[1] ||
       data->location[2] != parts[2]){
      data->location[0] = parts[0];
      data->location[1] = parts[1];
      data->location[2] = parts[2];
      mark_sources_dirty(data);
    }
    break;
  case MIXED_SPACE_VELOCITY:
    if(data->velocity[0] != parts[0] ||
       data->velocity[1] != parts[1] ||
       data->velocity[2] != parts[2]){
      data->velocity[0] = parts[0];
      data->velocity[1] = parts[1];
      data->velocity[2] = parts[2];
      mark_sources_dirty(data);
    }
    break;
  case MIXED_SPACE_DIRECTION:
    if(data->direction[0] != parts[0] ||
       data->direction[1] != parts[1] ||
       data->direction[2] != parts[2]){
      data->direction[0] = parts[0];
      data->direction[1] = parts[1];
      data->direction[2] = parts[2];
      recompute_look_at(data);
      mark_sources_dirty(data);
    }
    break;
  case MIXED_SPACE_UP:
    if(data->up[0] != parts[0] ||
       data->up[1] != parts[1] ||
       data->up[2] != parts[2]){
      data->up[0] = parts[0];
      data->up[1] = parts[1];
      data->up[2] = parts[2];
      recompute_look_at(data);
      mark_sources_dirty(data);
    }
    break;
  case MIXED_SPACE_SOUNDSPEED:
    data->soundspeed = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_DOPPLER_FACTOR:
    data->doppler_factor = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_MIN_DISTANCE:
    data->min_distance = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_MAX_DISTANCE:
    data->max_distance = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_ROLLOFF:
    data->rolloff = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_ATTENUATION:
    switch(*(uint32_t *)value){
    case MIXED_NO_ATTENUATION:
      data->attenuation = attenuation_none;
      break;
    case MIXED_INVERSE_ATTENUATION:
      data->attenuation = attenuation_inverse;
      break;
    case MIXED_LINEAR_ATTENUATION:
      data->attenuation = attenuation_linear;
      break;
    case MIXED_EXPONENTIAL_ATTENUATION:
      data->attenuation = attenuation_exponential;
      break;
    default:
      data->attenuation = (float (*)(float min, float max, float dist, float roll))value;
      break;
    }
    mark_sources_dirty(data);
    break;
  case MIXED_OUT_COUNT:
    memcpy(&data->channels, mixed_default_channel_configuration(*(uint32_t *)value), sizeof(struct mixed_channel_configuration));
    if(!make_vbap_from_configuration(&data->channels, &data->vbap)) return 0;
    data->out = mixed_realloc(data->out, data->channels.count*sizeof(struct mixed_buffer *));
    if(!data->out){
      mixed_err(MIXED_OUT_OF_MEMORY);
      return 0;
    }
    data->surround = mixed_configuration_is_surround(&data->channels);
    mark_sources_dirty(data);
    break;
  case MIXED_CHANNEL_CONFIGURATION:
    memcpy(&data->channels, (struct mixed_channel_configuration *)value, sizeof(struct mixed_channel_configuration));
    if(!make_vbap_from_configuration(&data->channels, &data->vbap)) return 0;
    data->out = mixed_realloc(data->out, data->channels.count*sizeof(struct mixed_buffer *));
    if(!data->out){
      mixed_err(MIXED_OUT_OF_MEMORY);
      return 0;
    }
    data->surround = mixed_configuration_is_surround(&data->channels);
    mark_sources_dirty(data);
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}